

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

string * __thiscall
CLI::Formatter::make_group
          (Formatter *this,string *group,bool is_positional,
          vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *opts)

{
  bool bVar1;
  ostream *poVar2;
  reference ppOVar3;
  byte in_CL;
  string *in_RDX;
  long *in_RSI;
  string *in_RDI;
  Option *opt;
  iterator __end1;
  iterator __begin1;
  vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *__range1;
  stringstream out;
  vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *in_stack_fffffffffffffdb8;
  ostream *in_stack_fffffffffffffdc0;
  string local_200 [32];
  Option *local_1e0;
  Option **local_1d8;
  __normal_iterator<const_CLI::Option_**,_std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>_>
  local_1d0 [4];
  stringstream local_1b0 [16];
  ostream local_1a0 [391];
  byte local_19;
  
  local_19 = in_CL & 1;
  ::std::__cxx11::stringstream::stringstream(local_1b0);
  poVar2 = ::std::operator<<(local_1a0,"\n");
  poVar2 = ::std::operator<<(poVar2,in_RDX);
  ::std::operator<<(poVar2,":\n");
  local_1d0[0]._M_current =
       (Option **)
       std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::begin
                 (in_stack_fffffffffffffdb8);
  local_1d8 = (Option **)
              std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::end
                        (in_stack_fffffffffffffdb8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_CLI::Option_**,_std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>_>
                        *)in_stack_fffffffffffffdc0,
                       (__normal_iterator<const_CLI::Option_**,_std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>_>
                        *)in_stack_fffffffffffffdb8);
    if (!bVar1) break;
    ppOVar3 = __gnu_cxx::
              __normal_iterator<const_CLI::Option_**,_std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>_>
              ::operator*(local_1d0);
    local_1e0 = *ppOVar3;
    in_stack_fffffffffffffdc0 = local_1a0;
    (**(code **)(*in_RSI + 0x58))(local_200,in_RSI,local_1e0,local_19 & 1);
    ::std::operator<<(in_stack_fffffffffffffdc0,local_200);
    ::std::__cxx11::string::~string(local_200);
    __gnu_cxx::
    __normal_iterator<const_CLI::Option_**,_std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>_>
    ::operator++(local_1d0);
  }
  ::std::__cxx11::stringstream::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b0);
  return in_RDI;
}

Assistant:

CLI11_INLINE std::string
Formatter::make_group(std::string group, bool is_positional, std::vector<const Option *> opts) const {
    std::stringstream out;

    out << "\n" << group << ":\n";
    for(const Option *opt : opts) {
        out << make_option(opt, is_positional);
    }

    return out.str();
}